

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wopn_file.c
# Opt level: O3

int WOPN_LoadInstFromMem(OPNIFile *file,void *mem,size_t length)

{
  ushort version;
  long lVar1;
  long lVar2;
  
  if (mem == (void *)0x0) {
    return 6;
  }
  if (10 < length) {
    if (*(long *)((long)mem + 3) == 0x54534e492d324e && *mem == 0x4e492d324e504f57) {
      version = 1;
      lVar1 = -0xb;
      lVar2 = 0xb;
    }
    else {
      if (*(long *)((long)mem + 3) != 0x54324e492d324e || *mem != 0x4e492d324e504f57) {
        return 1;
      }
      if (length - 0xb < 2) {
        return 2;
      }
      version = *(ushort *)((long)mem + 0xb);
      if (2 < version) {
        return 4;
      }
      lVar1 = -0xd;
      lVar2 = 0xd;
    }
    file->version = version;
    if (lVar1 + length != 0) {
      file->is_drum = *(uint8_t *)((long)mem + lVar2);
      if (0x41 < lVar1 + length) {
        WOPN_parseInstrument(&file->inst,(uint8_t *)((long)mem + lVar2) + 1,version,'\0');
        return 0;
      }
      return 2;
    }
  }
  return 2;
}

Assistant:

int WOPN_LoadInstFromMem(OPNIFile *file, void *mem, size_t length)
{
    uint16_t version = 0;
    uint8_t *cursor = (uint8_t *)mem;
    uint16_t ins_size;

    if(!cursor)
        return WOPN_ERR_NULL_POINTER;

#define GO_FORWARD(bytes) { cursor += bytes; length -= bytes; }

    {/* Magic number */
        if(length < 11)
            return WOPN_ERR_UNEXPECTED_ENDING;
        if(memcmp(cursor, opni_magic1, 11) == 0)
            version = 1;
        else if(memcmp(cursor, opni_magic2, 11) != 0)
            return WOPN_ERR_BAD_MAGIC;
        GO_FORWARD(11);
    }

    if (version == 0) {/* Version code */
        if(length < 2)
            return WOPN_ERR_UNEXPECTED_ENDING;
        version = toUint16LE(cursor);
        if(version > wopn_latest_version)
            return WOPN_ERR_NEWER_VERSION;
        GO_FORWARD(2);
    }

    file->version = version;

    {/* is drum flag */
        if(length < 1)
            return WOPN_ERR_UNEXPECTED_ENDING;
        file->is_drum = *cursor;
        GO_FORWARD(1);
    }

    if(version > 1)
        /* Skip sounding delays are not part of single-instrument file
         * two sizes of uint16_t will be subtracted */
        ins_size = WOPN_INST_SIZE_V2 - (sizeof(uint16_t) * 2);
    else
        ins_size = WOPN_INST_SIZE_V1;

    if(length < ins_size)
        return WOPN_ERR_UNEXPECTED_ENDING;

    WOPN_parseInstrument(&file->inst, cursor, version, 0);
    GO_FORWARD(ins_size);

    return WOPN_ERR_OK;
#undef GO_FORWARD
}